

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleBuilder.cpp
# Opt level: O3

void __thiscall
Refal2::CModuleBuilder::SetOrdinary(CModuleBuilder *this,CToken *nameToken,CRulePtr *firstRule)

{
  bool bVar1;
  TLabel function;
  CPreparatoryFunction *function_00;
  
  bVar1 = checkModuleExist(this,nameToken);
  if (bVar1) {
    function = declare(this,nameToken);
    function_00 = getFunction(this,function);
    bVar1 = checkOnlyDeclared(this,function_00,nameToken);
    if (bVar1) {
      CPreparatoryFunction::SetDefined(function_00,nameToken);
      CPreparatoryFunction::SetOrdinary(function_00,firstRule);
      return;
    }
  }
  return;
}

Assistant:

void CModuleBuilder::SetOrdinary( const CToken& nameToken, CRulePtr& firstRule )
{
	if( !checkModuleExist( nameToken ) ) {
		return;
	}
	CPreparatoryFunction& function = addFunction( nameToken );
	if( checkOnlyDeclared( function, nameToken ) ) {
		function.SetDefined( nameToken );
		function.SetOrdinary( firstRule );
	}
}